

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixUnlock(sqlite3_file *id,int eFileLock)

{
  undefined1 *puVar1;
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 **pp_Var2;
  _func_int_sqlite3_file_ptr_int **pp_Var3;
  sqlite3_io_methods *psVar4;
  int iVar5;
  sqlite3_mutex *psVar6;
  int *piVar7;
  undefined1 *puVar8;
  flock local_48;
  
  if ((int)(uint)*(byte *)((long)&id[3].pMethods + 4) <= eFileLock) {
    return 0;
  }
  if (sqlite3Config.bCoreMutex == 0) {
    psVar6 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar6 = (*sqlite3Config.mutex.xMutexAlloc)(2);
  }
  if (psVar6 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar6);
  }
  puVar1 = (undefined1 *)((long)&id[3].pMethods + 4);
  psVar4 = id[2].pMethods;
  if (1 < *(byte *)((long)&id[3].pMethods + 4)) {
    if (eFileLock == 1) {
      local_48.l_type = 0;
      local_48.l_whence = 0;
      local_48.l_start = (long)sqlite3PendingByte + 2;
      local_48.l_len = 0x1fe;
      iVar5 = unixFileLock((unixFile *)id,&local_48);
      if (iVar5 != 0) {
        piVar7 = __errno_location();
        *(int *)&id[4].pMethods = *piVar7;
        iVar5 = 0x90a;
        goto LAB_00156a83;
      }
    }
    local_48.l_type = 2;
    local_48.l_whence = 0;
    local_48.l_start = (__off64_t)sqlite3PendingByte;
    local_48.l_len = 2;
    iVar5 = unixFileLock((unixFile *)id,&local_48);
    if (iVar5 != 0) {
      piVar7 = __errno_location();
      *(int *)&id[4].pMethods = *piVar7;
      iVar5 = 0x80a;
      goto LAB_00156a83;
    }
    *(undefined1 *)((long)&psVar4->xRead + 4) = 1;
  }
  iVar5 = 0;
  if (eFileLock == 0) {
    iVar5 = 0;
    pp_Var2 = &psVar4->xRead;
    *(int *)pp_Var2 = *(int *)pp_Var2 + -1;
    if (*(int *)pp_Var2 == 0) {
      local_48.l_type = 2;
      local_48.l_whence = 0;
      local_48.l_start = 0;
      local_48.l_len = 0;
      iVar5 = unixFileLock((unixFile *)id,&local_48);
      if (iVar5 == 0) {
        puVar8 = (undefined1 *)((long)&psVar4->xRead + 4);
        iVar5 = 0;
      }
      else {
        piVar7 = __errno_location();
        *(int *)&id[4].pMethods = *piVar7;
        *(undefined1 *)((long)&psVar4->xRead + 4) = 0;
        iVar5 = 0x80a;
        puVar8 = puVar1;
      }
      *puVar8 = 0;
    }
    pp_Var3 = &psVar4->xSync;
    *(int *)pp_Var3 = *(int *)pp_Var3 + -1;
    if (*(int *)pp_Var3 == 0) {
      closePendingFds((unixFile *)id);
    }
  }
LAB_00156a83:
  if (sqlite3Config.bCoreMutex == 0) {
    psVar6 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar6 = (*sqlite3Config.mutex.xMutexAlloc)(2);
  }
  if (psVar6 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar6);
  }
  if (iVar5 == 0) {
    *puVar1 = (char)eFileLock;
  }
  return iVar5;
}

Assistant:

static int posixUnlock(sqlite3_file *id, int eFileLock, int handleNFSUnlock){
  unixFile *pFile = (unixFile*)id;
  unixInodeInfo *pInode;
  struct flock lock;
  int rc = SQLITE_OK;

  assert( pFile );
  OSTRACE(("UNLOCK  %d %d was %d(%d,%d) pid=%d (unix)\n", pFile->h, eFileLock,
      pFile->eFileLock, pFile->pInode->eFileLock, pFile->pInode->nShared,
      getpid()));

  assert( eFileLock<=SHARED_LOCK );
  if( pFile->eFileLock<=eFileLock ){
    return SQLITE_OK;
  }
  unixEnterMutex();
  pInode = pFile->pInode;
  assert( pInode->nShared!=0 );
  if( pFile->eFileLock>SHARED_LOCK ){
    assert( pInode->eFileLock==pFile->eFileLock );

#ifdef SQLITE_DEBUG
    /* When reducing a lock such that other processes can start
    ** reading the database file again, make sure that the
    ** transaction counter was updated if any part of the database
    ** file changed.  If the transaction counter is not updated,
    ** other connections to the same file might not realize that
    ** the file has changed and hence might not know to flush their
    ** cache.  The use of a stale cache can lead to database corruption.
    */
    pFile->inNormalWrite = 0;
#endif

    /* downgrading to a shared lock on NFS involves clearing the write lock
    ** before establishing the readlock - to avoid a race condition we downgrade
    ** the lock in 2 blocks, so that part of the range will be covered by a 
    ** write lock until the rest is covered by a read lock:
    **  1:   [WWWWW]
    **  2:   [....W]
    **  3:   [RRRRW]
    **  4:   [RRRR.]
    */
    if( eFileLock==SHARED_LOCK ){

#if !defined(__APPLE__) || !SQLITE_ENABLE_LOCKING_STYLE
      (void)handleNFSUnlock;
      assert( handleNFSUnlock==0 );
#endif
#if defined(__APPLE__) && SQLITE_ENABLE_LOCKING_STYLE
      if( handleNFSUnlock ){
        int tErrno;               /* Error code from system call errors */
        off_t divSize = SHARED_SIZE - 1;
        
        lock.l_type = F_UNLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST;
        lock.l_len = divSize;
        if( unixFileLock(pFile, &lock)==(-1) ){
          tErrno = errno;
          rc = SQLITE_IOERR_UNLOCK;
          if( IS_LOCK_ERROR(rc) ){
            pFile->lastErrno = tErrno;
          }
          goto end_unlock;
        }
        lock.l_type = F_RDLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST;
        lock.l_len = divSize;
        if( unixFileLock(pFile, &lock)==(-1) ){
          tErrno = errno;
          rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_RDLOCK);
          if( IS_LOCK_ERROR(rc) ){
            pFile->lastErrno = tErrno;
          }
          goto end_unlock;
        }
        lock.l_type = F_UNLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST+divSize;
        lock.l_len = SHARED_SIZE-divSize;
        if( unixFileLock(pFile, &lock)==(-1) ){
          tErrno = errno;
          rc = SQLITE_IOERR_UNLOCK;
          if( IS_LOCK_ERROR(rc) ){
            pFile->lastErrno = tErrno;
          }
          goto end_unlock;
        }
      }else
#endif /* defined(__APPLE__) && SQLITE_ENABLE_LOCKING_STYLE */
      {
        lock.l_type = F_RDLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST;
        lock.l_len = SHARED_SIZE;
        if( unixFileLock(pFile, &lock) ){
          /* In theory, the call to unixFileLock() cannot fail because another
          ** process is holding an incompatible lock. If it does, this 
          ** indicates that the other process is not following the locking
          ** protocol. If this happens, return SQLITE_IOERR_RDLOCK. Returning
          ** SQLITE_BUSY would confuse the upper layer (in practice it causes 
          ** an assert to fail). */ 
          rc = SQLITE_IOERR_RDLOCK;
          pFile->lastErrno = errno;
          goto end_unlock;
        }
      }
    }
    lock.l_type = F_UNLCK;
    lock.l_whence = SEEK_SET;
    lock.l_start = PENDING_BYTE;
    lock.l_len = 2L;  assert( PENDING_BYTE+1==RESERVED_BYTE );
    if( unixFileLock(pFile, &lock)==0 ){
      pInode->eFileLock = SHARED_LOCK;
    }else{
      rc = SQLITE_IOERR_UNLOCK;
      pFile->lastErrno = errno;
      goto end_unlock;
    }
  }
  if( eFileLock==NO_LOCK ){
    /* Decrement the shared lock counter.  Release the lock using an
    ** OS call only when all threads in this same process have released
    ** the lock.
    */
    pInode->nShared--;
    if( pInode->nShared==0 ){
      lock.l_type = F_UNLCK;
      lock.l_whence = SEEK_SET;
      lock.l_start = lock.l_len = 0L;
      if( unixFileLock(pFile, &lock)==0 ){
        pInode->eFileLock = NO_LOCK;
      }else{
        rc = SQLITE_IOERR_UNLOCK;
        pFile->lastErrno = errno;
        pInode->eFileLock = NO_LOCK;
        pFile->eFileLock = NO_LOCK;
      }
    }

    /* Decrement the count of locks against this same file.  When the
    ** count reaches zero, close any other file descriptors whose close
    ** was deferred because of outstanding locks.
    */
    pInode->nLock--;
    assert( pInode->nLock>=0 );
    if( pInode->nLock==0 ){
      closePendingFds(pFile);
    }
  }

end_unlock:
  unixLeaveMutex();
  if( rc==SQLITE_OK ) pFile->eFileLock = eFileLock;
  return rc;
}